

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O3

void recff_cdata_arith(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  CTState *cts;
  CType *pCVar2;
  CTState *cts_00;
  TValue *pTVar3;
  uint64_t uVar4;
  int32_t k;
  uint *puVar5;
  bool bVar6;
  ushort uVar7;
  IRRef1 IVar8;
  IRType IVar9;
  TRef TVar10;
  TRef TVar11;
  CTSize CVar12;
  CTypeID CVar13;
  GCcdata *pGVar14;
  CType *pCVar15;
  cTValue *pcVar16;
  TRef *pTVar17;
  ushort uVar18;
  ushort uVar19;
  IROpT IVar20;
  uint uVar21;
  uint **ppuVar22;
  uint uVar23;
  uint uVar24;
  uint *puVar25;
  TRef tr;
  GCobj *o;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  bool bVar29;
  CTInfo CVar30;
  IRRef1 IVar31;
  uint **ppuVar32;
  CTSize ofs;
  uint local_68;
  uint local_64;
  RecordFFData *local_60;
  uint *local_58 [2];
  uint *local_48;
  int32_t local_40;
  CTSize local_3c;
  uint *local_38;
  
  cts = *(CTState **)&J[-1].penalty[0x3c].val;
  puVar25 = &local_64;
  ppuVar32 = local_58;
  uVar26 = 0;
  local_60 = rd;
  bVar6 = true;
  do {
    bVar29 = bVar6;
    uVar24 = J->base[uVar26];
    if (uVar24 == 0) goto LAB_0015ee93;
    uVar21 = uVar24 & 0x1f000000;
    if (uVar21 == 0) {
      uVar24 = lj_ir_kptr_(J,IR_KPTR,(void *)0x0);
      pCVar15 = cts->tab + 0x11;
    }
    else {
      IVar31 = (IRRef1)uVar24;
      if (uVar21 == 0xa000000) {
        pGVar14 = argv2cdata(J,uVar24,local_60->argv + uVar26);
        uVar19 = pGVar14->ctypeid;
        uVar24 = cts->tab[uVar19].info;
        pCVar15 = cts->tab + uVar19;
        IVar9 = crec_ct2irt(cts,pCVar15);
        uVar24 = uVar24 >> 0x1c;
        uVar18 = (ushort)IVar9;
        if (uVar24 == 2) {
          (J->fold).ins.field_0.ot = uVar18 | 0x4500;
          (J->fold).ins.field_0.op1 = IVar31;
          (J->fold).ins.field_0.op2 = 0x17;
          uVar24 = lj_opt_fold(J);
          CVar30 = pCVar15->info;
          if ((CVar30 & 0xf0800000) == 0x20800000) {
            uVar21 = CVar30 & 0xffff;
            CVar30 = cts->tab[uVar21].info;
            pCVar15 = cts->tab + uVar21;
            IVar9 = crec_ct2irt(cts,pCVar15);
          }
LAB_0015e30e:
          if ((CVar30 & 0xf0000000) == 0x50000000) {
            pCVar15 = cts->tab + (CVar30 & 0xffff);
            CVar30 = pCVar15->info;
          }
          if (CVar30 < 0x10000000) {
            if (IVar9 == IRT_CDATA) {
LAB_0015e5dc:
              uVar24 = 0;
            }
            else {
              (J->fold).ins.field_0.ot = (ushort)IVar9 | 0x4600;
              (J->fold).ins.field_0.op1 = (IRRef1)uVar24;
              (J->fold).ins.field_0.op2 = 0;
              uVar24 = lj_opt_fold(J);
            }
          }
        }
        else if (IVar9 - IRT_I64 < 2) {
          (J->fold).ins.field_0.ot = uVar18 | 0x4500;
          (J->fold).ins.field_0.op1 = IVar31;
          (J->fold).ins.field_0.op2 = 0x19;
          uVar24 = lj_opt_fold(J);
        }
        else if (IVar9 - IRT_INT < 2) {
          (J->fold).ins.field_0.ot = uVar18 | 0x4500;
          (J->fold).ins.field_0.op1 = IVar31;
          (J->fold).ins.field_0.op2 = 0x18;
          uVar24 = lj_opt_fold(J);
          if ((pCVar15->info & 0xf0000000) == 0x50000000) {
            pCVar15 = (CType *)((long)&cts->tab->info + (ulong)((pCVar15->info & 0xffff) * 0x18));
          }
        }
        else {
          if (uVar24 != 6) {
            TVar10 = lj_ir_kint64(J,0x10);
            (J->fold).ins.field_0.ot = 0x2909;
            (J->fold).ins.field_0.op1 = IVar31;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
            uVar24 = lj_opt_fold(J);
            CVar30 = pCVar15->info;
            goto LAB_0015e30e;
          }
          (J->fold).ins.field_0.op1 = IVar31;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090017;
          uVar24 = lj_opt_fold(J);
          CVar13 = lj_ctype_intern(cts,uVar19 | 0x20030000,8);
          pCVar15 = cts->tab + CVar13;
        }
      }
      else {
        pCVar15 = cts->tab;
        if ((uVar24 >> 0x18 & 0x1f) - 0xf < 5) {
          pCVar15 = pCVar15 + 9;
        }
        else if (uVar21 == 0xe000000) {
          pCVar15 = pCVar15 + 0xe;
        }
        else {
          if (uVar21 != 0x4000000) {
            pCVar15 = pCVar15 + 0x11;
            goto LAB_0015e5dc;
          }
          pGVar14 = argv2cdata(J,J->base[uVar26 ^ 1],local_60->argv + (uVar26 ^ 1));
          pCVar2 = cts->tab;
          pCVar15 = pCVar2 + pGVar14->ctypeid;
          uVar21 = pCVar2[pGVar14->ctypeid].info >> 0x1c;
          if (uVar21 == 2) {
            TVar10 = lj_ir_kint64(J,0x18);
            (J->fold).ins.field_0.ot = 0x2909;
            (J->fold).ins.field_0.op1 = IVar31;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
            uVar24 = lj_opt_fold(J);
          }
          else if (uVar21 == 5) {
            o = (GCobj *)(local_60->argv[uVar26].u64 & 0x7fffffffffff);
            pCVar15 = lj_ctype_getfieldq(cts,pCVar15,&o->str,&local_3c,(CTInfo *)0x0);
            if ((pCVar15 == (CType *)0x0) || ((pCVar15->info & 0xf0000000) != 0xb0000000)) {
              pCVar15 = cts->tab + 0x11;
            }
            else {
              TVar10 = lj_ir_kgc(J,o,IRT_STR);
              (J->fold).ins.field_0.ot = 0x884;
              (J->fold).ins.field_0.op1 = IVar31;
              (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
              lj_opt_fold(J);
              pCVar15 = (CType *)((long)&cts->tab->info +
                                 (ulong)((uint)(ushort)pCVar15->info * 0x18));
              uVar24 = lj_ir_kint(J,local_3c);
            }
          }
          else {
            pCVar15 = pCVar2 + 0x11;
          }
        }
      }
    }
    *ppuVar32 = &pCVar15->info;
    *puVar25 = uVar24;
    puVar5 = local_58[0];
    uVar26 = 1;
    ppuVar32 = &local_48;
    puVar25 = &local_68;
    bVar6 = false;
  } while (bVar29);
  uVar24 = local_60->data;
  if ((((uVar24 == 5) || (uVar24 == 8)) || (uVar26 = (ulong)local_64, uVar26 == 0)) ||
     (uVar28 = (ulong)local_68, uVar28 == 0)) goto LAB_0015ec51;
  uVar21 = *local_58[0];
  puVar25 = local_48;
  if ((uVar21 < 0x10000000) && (uVar23 = *local_48, uVar23 < 0x10000000)) {
    local_38 = local_48;
    if ((((uVar21 >> 0x17 & 1) == 0) || (local_58[0][1] != 8)) &&
       (((uVar23 >> 0x17 & 1) == 0 || (local_48[1] != 8)))) {
      uVar19 = 0x15;
      local_40 = 0xb;
      if (((9 < uVar24) ||
          (((((uVar23 | uVar21) >> 0x1a & 1) != 0 || (local_58[0][1] != 4)) || (local_48[1] != 4))))
         || (((((uVar23 ^ uVar21) >> 0x17 & 1) != 0 &&
              (((short)local_68 < 0 || ((J->cur).ir[local_68 & 0x7fff].i < 0)))) &&
             (((short)local_64 < 0 || (uVar21 = uVar23, (J->cur).ir[local_64 & 0x7fff].i < 0))))))
      goto LAB_0015e803;
      uVar19 = ((uVar21 >> 0x17 & 1) != 0) + 0x13;
    }
    else {
      uVar19 = 0x16;
      local_40 = 0xc;
LAB_0015e803:
      puVar25 = &local_64;
      ppuVar22 = local_58;
      bVar6 = true;
      do {
        bVar29 = bVar6;
        uVar21 = *puVar25;
        uVar23 = uVar21 >> 0x18 & 0x1f;
        if (uVar23 - 0xd < 2) {
          uVar18 = (short)uVar23 + uVar19 * 0x20 + 0x1000;
LAB_0015e86b:
          (J->fold).ins.field_0.ot = uVar19 + 0x5b00;
          (J->fold).ins.field_0.op1 = (IRRef1)uVar21;
          (J->fold).ins.field_0.op2 = uVar18;
          TVar10 = lj_opt_fold(J);
          *puVar25 = TVar10;
        }
        else if (1 < uVar23 - 0x15) {
          uVar18 = ((ushort)(**ppuVar22 >> 0xc) & 0x800 | uVar19 * 0x20) ^ 0x813;
          goto LAB_0015e86b;
        }
        uVar23 = local_64;
        uVar21 = local_68;
        puVar25 = &local_68;
        ppuVar22 = ppuVar32;
        bVar6 = false;
      } while (bVar29);
      if (9 < uVar24) {
        uVar26 = (ulong)local_64;
        uVar28 = (ulong)local_68;
        (J->fold).ins.field_0.ot = (short)(uVar24 << 8) + uVar19 + 0x1f00;
        (J->fold).ins.field_0.op1 = (IRRef1)local_64;
        (J->fold).ins.field_0.op2 = (IRRef1)local_68;
        TVar10 = lj_opt_fold(J);
        TVar11 = lj_ir_kint(J,local_40);
        (J->fold).ins.field_0.ot = 0x548a;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar11;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
        TVar10 = lj_opt_fold(J);
        if (TVar10 != 0) goto LAB_0015ee2a;
        puVar25 = local_38;
        if (uVar21 == 0 || uVar23 == 0) goto LAB_0015ec51;
        goto LAB_0015e97e;
      }
    }
    uVar18 = 0x800;
    if (uVar24 != 4) {
      uVar7 = (ushort)(uVar24 != 6) * 0x200;
      uVar18 = uVar7 + 0x400;
      if ((uVar19 & 0xfffd) != 0x14) {
        uVar18 = uVar7;
      }
    }
    uVar19 = uVar18 | uVar19 | 0x80;
    uVar26 = (ulong)local_64;
    uVar28 = (ulong)local_68;
    goto LAB_0015eb50;
  }
LAB_0015e97e:
  cts_00 = *(CTState **)&J[-1].penalty[0x3c].val;
  uVar21 = *puVar5;
  uVar23 = (uint)uVar26;
  if ((uVar21 & 0xf0000000) == 0x20000000 || (uVar21 & 0xfc000000) == 0x30000000) {
    if (((0xb < uVar24) || ((0x8d0U >> (uVar24 & 0x1f) & 1) == 0)) ||
       ((*puVar25 & 0xf0000000) != 0x20000000 && (*puVar25 & 0xfc000000) != 0x30000000)) {
      if (((uVar24 & 0xfffffffe) == 10) &&
         (uVar1 = *puVar25, puVar25 = puVar5, uVar26 = uVar28, uVar27 = uVar23, uVar1 < 0x10000000))
      goto LAB_0015eaf6;
      goto LAB_0015ec51;
    }
    if (uVar24 != 4) {
      if (uVar24 != 0xb) {
        uVar19 = (ushort)(uVar24 != 6) << 9 | 0x489;
        goto LAB_0015eb50;
      }
      CVar12 = lj_ctype_size(cts_00,uVar21 & 0xffff);
      if (POPCOUNT(CVar12) != 1) goto LAB_0015ec51;
      (J->fold).ins.field_0.ot = 0x2a15;
      (J->fold).ins.field_0.op1 = (IRRef1)uVar26;
      (J->fold).ins.field_0.op2 = (IRRef1)uVar28;
      TVar10 = lj_opt_fold(J);
      k = 0x1f;
      if (CVar12 != 0) {
        for (; CVar12 >> k == 0; k = k + -1) {
        }
      }
      TVar11 = lj_ir_kint(J,k);
      (J->fold).ins.field_0.ot = 0x2615;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar10;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
      TVar10 = lj_opt_fold(J);
      IVar8 = (IRRef1)TVar10;
      IVar31 = 0x1d5;
      IVar20 = 0x5b0e;
      goto LAB_0015ec27;
    }
    uVar19 = 0x889;
LAB_0015eb50:
    IVar8 = (IRRef1)uVar28;
    IVar31 = (IRRef1)uVar26;
  }
  else {
    if ((uVar21 < 0x10000000 && uVar24 == 10) &&
       (uVar21 = *puVar25,
       (uVar21 & 0xf0000000) == 0x20000000 || (uVar21 & 0xfc000000) == 0x30000000)) {
      uVar27 = (uint)uVar28;
      local_68 = uVar23;
      local_64 = uVar27;
LAB_0015eaf6:
      uVar23 = (uint)(uVar26 >> 0x18) & 0x1f;
      CVar12 = lj_ctype_size(cts_00,uVar21 & 0xffff);
      if (uVar23 - 0xd < 2) {
        IVar31 = (ushort)uVar23 | 0x12a0;
LAB_0015eb6e:
        (J->fold).ins.field_0.ot = 0x5b15;
        (J->fold).ins.field_0.op1 = (IRRef1)uVar26;
        (J->fold).ins.field_0.op2 = IVar31;
        TVar10 = lj_opt_fold(J);
        uVar26 = (ulong)TVar10;
      }
      else if (1 < uVar23 - 0x15) {
        IVar31 = (ushort)(uVar26 >> 0xd) & 0x800 | 0x2b3;
        goto LAB_0015eb6e;
      }
      TVar10 = lj_ir_kint64(J,(ulong)CVar12);
      (J->fold).ins.field_0.ot = 0x2b15;
      (J->fold).ins.field_0.op1 = (IRRef1)uVar26;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
      TVar10 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = (short)(uVar24 << 8) + 0x1f09;
      (J->fold).ins.field_0.op1 = (IRRef1)uVar27;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
      TVar10 = lj_opt_fold(J);
      IVar31 = (IRRef1)TVar10;
      CVar13 = lj_ctype_intern(cts_00,(ushort)*puVar25 | 0x20030000,8);
      TVar10 = lj_ir_kint(J,CVar13);
      IVar8 = (IRRef1)TVar10;
      IVar20 = 0x548a;
LAB_0015ec27:
      (J->fold).ins.field_0.ot = IVar20;
      (J->fold).ins.field_0.op1 = IVar8;
      (J->fold).ins.field_0.op2 = IVar31;
      TVar10 = lj_opt_fold(J);
      if (TVar10 != 0) goto LAB_0015ee2a;
    }
LAB_0015ec51:
    pTVar17 = J->base;
    if (*pTVar17 != 0) {
      if ((local_60->argv->field_4).it >> 0xf == 0x1fff5) {
        pGVar14 = argv2cdata(J,*pTVar17,local_60->argv);
        uVar24 = cts->tab[pGVar14->ctypeid].info;
        uVar21 = (uint)pGVar14->ctypeid;
        if ((uVar24 & 0xf0000000) == 0x20000000) {
          uVar21 = uVar24 & 0xffff;
        }
        pcVar16 = lj_ctype_meta(cts,uVar21,local_60->data);
        if (pcVar16 == (cTValue *)0x0) {
          pTVar17 = J->base;
          goto LAB_0015ece1;
        }
LAB_0015ed5d:
        if ((pcVar16->u64 & 0xffff800000000000) == 0xfffb800000000000) {
          TVar10 = lj_ir_kgc(J,(GCobj *)(pcVar16->u64 & 0x7fffffffffff),IRT_FUNC);
          pTVar17 = J->base;
          pTVar17[-2] = TVar10;
          pTVar17[-1] = 0x10000;
          local_60->nres = -1;
          return;
        }
        goto LAB_0015ee93;
      }
LAB_0015ece1:
      if ((pTVar17[1] != 0) && ((local_60->argv[1].u64 & 0xffff800000000000) == 0xfffa800000000000))
      {
        pGVar14 = argv2cdata(J,pTVar17[1],local_60->argv + 1);
        uVar24 = cts->tab[pGVar14->ctypeid].info;
        uVar21 = (uint)pGVar14->ctypeid;
        if ((uVar24 & 0xf0000000) == 0x20000000) {
          uVar21 = uVar24 & 0xffff;
        }
        pcVar16 = lj_ctype_meta(cts,uVar21,local_60->data);
        if (pcVar16 != (cTValue *)0x0) goto LAB_0015ed5d;
      }
    }
    if (local_60->data != 4) {
LAB_0015ee93:
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    IVar31 = (IRRef1)local_64;
    TVar10 = 0x1007ffe;
    if (((local_64 == 0) || (IVar8 = (IRRef1)local_68, local_68 == 0)) ||
       (uVar19 = 0x889, 0xfffffff < *local_48 == *local_58[0] < 0x10000000)) goto LAB_0015ee2a;
  }
  (J->fold).ins.field_0.ot = uVar19;
  (J->fold).ins.field_0.op1 = IVar31;
  (J->fold).ins.field_0.op2 = IVar8;
  J->postproc = LJ_POST_FIXGUARD;
  TVar10 = 0x2007ffd;
LAB_0015ee2a:
  *J->base = TVar10;
  if (((J->postproc == LJ_POST_FIXGUARD) && (pTVar3 = J->L->base, (pTVar3[-1].u32.lo & 7) == 2)) &&
     ((-1 < (char)(J->guardemit).irt &&
      (uVar4 = pTVar3[-3].u64, (*(uint *)(uVar4 - 4) & 0xfc) < 0xc)))) {
    J[-1].penalty[0x33].pc.ptr64 = uVar4 - 4;
    J->postproc = LJ_POST_FIXCOMP;
  }
  return;
}

Assistant:

void LJ_FASTCALL recff_cdata_arith(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  TRef sp[2];
  CType *s[2];
  MSize i;
  for (i = 0; i < 2; i++) {
    TRef tr = J->base[i];
    CType *ct = ctype_get(cts, CTID_DOUBLE);
    if (!tr) {
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    } else if (tref_iscdata(tr)) {
      CTypeID id = argv2cdata(J, tr, &rd->argv[i])->ctypeid;
      IRType t;
      ct = ctype_raw(cts, id);
      t = crec_ct2irt(cts, ct);
      if (ctype_isptr(ct->info)) {  /* Resolve pointer or reference. */
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_PTR);
	if (ctype_isref(ct->info)) {
	  ct = ctype_rawchild(cts, ct);
	  t = crec_ct2irt(cts, ct);
	}
      } else if (t == IRT_I64 || t == IRT_U64) {
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_INT64);
	lj_needsplit(J);
	goto ok;
      } else if (t == IRT_INT || t == IRT_U32) {
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_INT);
	if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
	goto ok;
      } else if (ctype_isfunc(ct->info)) {
	tr = emitir(IRT(IR_FLOAD, IRT_PTR), tr, IRFL_CDATA_PTR);
	ct = ctype_get(cts,
	  lj_ctype_intern(cts, CTINFO(CT_PTR, CTALIGN_PTR|id), CTSIZE_PTR));
	goto ok;
      } else {
	tr = emitir(IRT(IR_ADD, IRT_PTR), tr, lj_ir_kintp(J, sizeof(GCcdata)));
      }
      if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
      if (ctype_isnum(ct->info)) {
	if (t == IRT_CDATA) {
	  tr = 0;
	} else {
	  if (t == IRT_I64 || t == IRT_U64) lj_needsplit(J);
	  tr = emitir(IRT(IR_XLOAD, t), tr, 0);
	}
      }
    } else if (tref_isnil(tr)) {
      tr = lj_ir_kptr(J, NULL);
      ct = ctype_get(cts, CTID_P_VOID);
    } else if (tref_isinteger(tr)) {
      ct = ctype_get(cts, CTID_INT32);
    } else if (tref_isstr(tr)) {
      TRef tr2 = J->base[1-i];
      CTypeID id = argv2cdata(J, tr2, &rd->argv[1-i])->ctypeid;
      ct = ctype_raw(cts, id);
      if (ctype_isenum(ct->info)) {  /* Match string against enum constant. */
	GCstr *str = strV(&rd->argv[i]);
	CTSize ofs;
	CType *cct = lj_ctype_getfield(cts, ct, str, &ofs);
	if (cct && ctype_isconstval(cct->info)) {
	  /* Specialize to the name of the enum constant. */
	  emitir(IRTG(IR_EQ, IRT_STR), tr, lj_ir_kstr(J, str));
	  ct = ctype_child(cts, cct);
	  tr = lj_ir_kint(J, (int32_t)ofs);
	} else {  /* Interpreter will throw or return false. */
	  ct = ctype_get(cts, CTID_P_VOID);
	}
      } else if (ctype_isptr(ct->info)) {
	tr = emitir(IRT(IR_ADD, IRT_PTR), tr, lj_ir_kintp(J, sizeof(GCstr)));
      } else {
	ct = ctype_get(cts, CTID_P_VOID);
      }
    } else if (!tref_isnum(tr)) {
      tr = 0;
      ct = ctype_get(cts, CTID_P_VOID);
    }
  ok:
    s[i] = ct;
    sp[i] = tr;
  }
  {
    TRef tr;
    MMS mm = (MMS)rd->data;
    if ((mm == MM_len || mm == MM_concat ||
	 (!(tr = crec_arith_int64(J, sp, s, mm)) &&
	  !(tr = crec_arith_ptr(J, sp, s, mm)))) &&
	!(tr = crec_arith_meta(J, sp, s, cts, rd)))
      return;
    J->base[0] = tr;
    /* Fixup cdata comparisons, too. Avoids some cdata escapes. */
    if (J->postproc == LJ_POST_FIXGUARD && frame_iscont(J->L->base-1) &&
	!irt_isguard(J->guardemit)) {
      const BCIns *pc = frame_contpc(J->L->base-1) - 1;
      if (bc_op(*pc) <= BC_ISNEP) {
	J2G(J)->tmptv.u64 = (uint64_t)(uintptr_t)pc;
	J->postproc = LJ_POST_FIXCOMP;
      }
    }
  }
}